

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

int Precond(sunrealtype t,N_Vector c,N_Vector fc,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  sunrealtype *cdotdata;
  sunrealtype t_00;
  undefined4 *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  WebData in_R8;
  double dVar12;
  double in_XMM1_Qa;
  N_Vector rewt;
  void *arkode_mem;
  WebData wdata;
  sunrealtype *rewtdata;
  sunrealtype *cdata;
  sunrealtype *fsave;
  sunrealtype *f1;
  sunrealtype srur;
  sunrealtype save;
  sunrealtype r0;
  sunrealtype r;
  sunrealtype fac;
  sunrealtype uround;
  int flag;
  int mp;
  int mxmp;
  int ngy;
  int ngx;
  int ngrp;
  int *jyr;
  int *jxr;
  int jy;
  int jx;
  int jj;
  int j;
  int igy;
  int igx;
  int ig;
  int if00;
  int if0;
  int i;
  sunindextype **pivot;
  sunindextype ier;
  sunrealtype ***P;
  undefined8 in_stack_fffffffffffffee8;
  N_Vector funcname;
  void *flagvalue;
  WebData wdata_00;
  sunrealtype *cdata_00;
  double local_c8;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_5c;
  int local_4;
  
  flagvalue = in_R8->arkode_mem;
  lVar11 = N_VGetArrayPointer(in_RDI);
  funcname = in_R8->rewt;
  ARKodeGetErrWeights(flagvalue,funcname);
  iVar8 = check_flag(flagvalue,(char *)funcname,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  if (iVar8 == 0) {
    cdotdata = (sunrealtype *)N_VGetArrayPointer(funcname);
    iVar8 = in_R8->mp;
    dVar1 = in_R8->srur;
    iVar3 = in_R8->ngrp;
    iVar4 = in_R8->ngx;
    iVar5 = in_R8->ngy;
    iVar6 = in_R8->mxmp;
    cdata_00 = in_R8->fsave;
    wdata_00 = in_R8;
    t_00 = (sunrealtype)N_VGetArrayPointer(in_R8->tmp);
    local_c8 = (double)N_VWrmsNorm(in_RSI,funcname);
    local_c8 = ABS(in_XMM1_Qa) * 1000.0 * 2.220446049250313e-16 * 216.0 * local_c8;
    if ((local_c8 == 0.0) && (!NAN(local_c8))) {
      local_c8 = 1.0;
    }
    for (local_70 = 0; local_70 < iVar5; local_70 = local_70 + 1) {
      iVar7 = in_R8->jyr[local_70];
      for (local_6c = 0; local_6c < iVar4; local_6c = local_6c + 1) {
        iVar9 = iVar7 * iVar6 + in_R8->jxr[local_6c] * iVar8;
        for (local_74 = 0; local_74 < iVar8; local_74 = local_74 + 1) {
          iVar10 = iVar9 + local_74;
          dVar2 = *(double *)(lVar11 + (long)iVar10 * 8);
          if (dVar1 * ABS(dVar2) <= local_c8 / cdotdata[iVar10]) {
            dVar12 = local_c8 / cdotdata[iVar10];
          }
          else {
            dVar12 = dVar1 * ABS(dVar2);
          }
          *(double *)(lVar11 + (long)iVar10 * 8) = dVar12 + *(double *)(lVar11 + (long)iVar10 * 8);
          fblock(t_00,cdata_00,(int)((ulong)lVar11 >> 0x20),(int)lVar11,cdotdata,wdata_00);
          for (local_5c = 0; local_5c < iVar8; local_5c = local_5c + 1) {
            in_R8->P[local_6c + local_70 * iVar4][local_74][local_5c] =
                 (*(double *)((long)t_00 + (long)local_5c * 8) - cdata_00[iVar9 + local_5c]) *
                 (-in_XMM1_Qa / dVar12);
          }
          *(double *)(lVar11 + (long)iVar10 * 8) = dVar2;
        }
      }
    }
    for (local_68 = 0; local_68 < iVar3; local_68 = local_68 + 1) {
      SUNDlsMat_denseAddIdentity(in_R8->P[local_68],(long)iVar8);
      lVar11 = SUNDlsMat_denseGETRF
                         (in_R8->P[local_68],(long)iVar8,(long)iVar8,in_R8->pivot[local_68]);
      if (lVar11 != 0) {
        return 1;
      }
    }
    *in_RCX = 1;
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int Precond(sunrealtype t, N_Vector c, N_Vector fc, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype*** P;
  sunindextype ier;
  sunindextype** pivot;
  int i, if0, if00, ig, igx, igy, j, jj, jx, jy;
  int *jxr, *jyr, ngrp, ngx, ngy, mxmp, mp, flag;
  sunrealtype uround, fac, r, r0, save, srur;
  sunrealtype *f1, *fsave, *cdata, *rewtdata;
  WebData wdata;
  void* arkode_mem;
  N_Vector rewt;

  wdata      = (WebData)user_data;
  arkode_mem = wdata->arkode_mem;
  cdata      = N_VGetArrayPointer(c);
  rewt       = wdata->rewt;
  flag       = ARKodeGetErrWeights(arkode_mem, rewt);
  if (check_flag(&flag, "ARKodeGetErrWeights", 1)) { return (1); }
  rewtdata = N_VGetArrayPointer(rewt);

  uround = SUN_UNIT_ROUNDOFF;

  P     = wdata->P;
  pivot = wdata->pivot;
  jxr   = wdata->jxr;
  jyr   = wdata->jyr;
  mp    = wdata->mp;
  srur  = wdata->srur;
  ngrp  = wdata->ngrp;
  ngx   = wdata->ngx;
  ngy   = wdata->ngy;
  mxmp  = wdata->mxmp;
  fsave = wdata->fsave;

  /* Make mp calls to fblock to approximate each diagonal block of Jacobian.
     Here, fsave contains the base value of the rate vector and
     r0 is a minimum increment factor for the difference quotient. */

  f1 = N_VGetArrayPointer(wdata->tmp);

  fac = N_VWrmsNorm(fc, rewt);
  r0  = SUN_RCONST(1000.0) * fabs(gamma) * uround * NEQ * fac;
  if (r0 == ZERO) { r0 = ONE; }

  for (igy = 0; igy < ngy; igy++)
  {
    jy   = jyr[igy];
    if00 = jy * mxmp;
    for (igx = 0; igx < ngx; igx++)
    {
      jx  = jxr[igx];
      if0 = if00 + jx * mp;
      ig  = igx + igy * ngx;
      /* Generate ig-th diagonal block */
      for (j = 0; j < mp; j++)
      {
        /* Generate the jth column as a difference quotient */
        jj   = if0 + j;
        save = cdata[jj];
        r    = MAX(srur * fabs(save), r0 / rewtdata[jj]);
        cdata[jj] += r;
        fac = -gamma / r;
        fblock(t, cdata, jx, jy, f1, wdata);
        for (i = 0; i < mp; i++)
        {
          P[ig][j][i] = (f1[i] - fsave[if0 + i]) * fac;
        }
        cdata[jj] = save;
      }
    }
  }

  /* Add identity matrix and do LU decompositions on blocks. */

  for (ig = 0; ig < ngrp; ig++)
  {
    SUNDlsMat_denseAddIdentity(P[ig], mp);
    ier = SUNDlsMat_denseGETRF(P[ig], mp, mp, pivot[ig]);
    if (ier != 0) { return (1); }
  }

  *jcurPtr = SUNTRUE;
  return (0);
}